

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::AuthenticatedStream> * __thiscall
kj::_::NullableValue<kj::AuthenticatedStream>::operator=
          (NullableValue<kj::AuthenticatedStream> *this,
          NullableValue<kj::AuthenticatedStream> *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      AuthenticatedStream::~AuthenticatedStream(&(this->field_1).value);
    }
    if (other->isSet == true) {
      AuthenticatedStream::AuthenticatedStream(&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }